

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

ggwave_Instance ggwave_init(ggwave_Parameters parameters)

{
  GGWave *this;
  ggwave_Instance id;
  Parameters *in_stack_ffffffffffffffa8;
  int local_8;
  
  local_8 = 0;
  while( true ) {
    if (3 < local_8) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        fprintf((anonymous_namespace)::g_fptr,
                "Failed to create GGWave instance - reached maximum number of instances (%d)\n",4);
      }
      return -1;
    }
    if (*(long *)((anonymous_namespace)::g_instances + (long)local_8 * 8) == 0) break;
    local_8 = local_8 + 1;
  }
  this = (GGWave *)operator_new(0x5b8);
  GGWave::GGWave(this,in_stack_ffffffffffffffa8);
  *(GGWave **)((anonymous_namespace)::g_instances + (long)local_8 * 8) = this;
  return local_8;
}

Assistant:

ggwave_Instance ggwave_init(ggwave_Parameters parameters) {
    for (ggwave_Instance id = 0; id < GGWAVE_MAX_INSTANCES; ++id) {
        if (g_instances[id] == nullptr) {
            g_instances[id] = new GGWave({
                parameters.payloadLength,
                parameters.sampleRateInp,
                parameters.sampleRateOut,
                parameters.sampleRate,
                parameters.samplesPerFrame,
                parameters.soundMarkerThreshold,
                parameters.sampleFormatInp,
                parameters.sampleFormatOut,
                parameters.operatingMode});

            return id;
        }
    }

    ggprintf("Failed to create GGWave instance - reached maximum number of instances (%d)\n", GGWAVE_MAX_INSTANCES);

    return -1;
}